

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O3

bool cmCMakePolicyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  PolicyStatus PVar4;
  long lVar5;
  cmState *this;
  cmValue cVar6;
  char *pcVar7;
  PolicyID id;
  size_t sVar8;
  cmMakefile *pcVar9;
  bool parent_scope;
  pointer pbVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view value;
  PolicyID pid;
  size_type __dnew;
  PolicyID local_dc;
  undefined1 local_d8 [32];
  _WordT local_b8;
  char *pcStack_b0;
  _WordT local_a8;
  pointer local_a0;
  undefined8 local_98;
  char *local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_70 [48];
  string local_40;
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"requires at least one argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)pbVar10);
    if (iVar2 == 0) {
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 == 0x60) {
        iVar2 = std::__cxx11::string::compare((char *)(pbVar10 + 2));
        if (iVar2 == 0) {
          PVar4 = OLD;
        }
        else {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 2));
          if (iVar3 != 0) {
            pbVar10 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_d8._24_8_ = pbVar10[2]._M_dataplus._M_p;
            local_d8._16_8_ = pbVar10[2]._M_string_length;
            local_d8._0_8_ = (char *)0x26;
            local_d8._8_8_ = "SET given unrecognized policy status \"";
            local_b8 = 1;
            pcStack_b0 = "\"";
            views._M_len = 3;
            views._M_array = (iterator)local_d8;
            cmCatViews_abi_cxx11_((string *)local_70,views);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            local_40._M_dataplus._M_p = (pointer)local_70._0_8_;
            if ((undefined1 *)local_70._0_8_ == local_70 + 0x10) {
              return false;
            }
            goto LAB_001bbac2;
          }
          PVar4 = NEW;
        }
        bVar1 = cmMakefile::SetPolicy
                          (status->Makefile,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,PVar4);
        if (bVar1) {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1));
          bVar1 = true;
          if (iVar3 != 0 || iVar2 != 0) {
            return true;
          }
          this = cmMakefile::GetState(status->Makefile);
          pcVar7 = local_d8 + 0x10;
          local_d8._0_8_ = pcVar7;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"CMAKE_BACKWARDS_COMPATIBILITY","");
          cVar6 = cmState::GetInitializedCacheValue(this,(string *)local_d8);
          if ((char *)local_d8._0_8_ != pcVar7) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          if (cVar6.Value != (string *)0x0) {
            return true;
          }
          pcVar9 = status->Makefile;
          local_d8._0_8_ = pcVar7;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"CMAKE_BACKWARDS_COMPATIBILITY","");
          cmMakefile::AddCacheDefinition
                    (pcVar9,(string *)local_d8,"2.4",
                     "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                     ,STRING,false);
          local_70._16_8_ = local_d8._16_8_;
          local_70._0_8_ = local_d8._0_8_;
          if ((char *)local_d8._0_8_ == pcVar7) {
            return true;
          }
          goto LAB_001bbc81;
        }
        local_d8._0_8_ = local_d8 + 0x10;
        local_70._0_8_ = (char *)0x19;
        local_d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_d8,(ulong)local_70);
        local_d8._16_8_ = local_70._0_8_;
        builtin_strncpy((char *)local_d8._0_8_,"SET failed to set policy.",0x19);
        local_d8._8_8_ = local_70._0_8_;
        *(char *)(local_d8._0_8_ + local_70._0_8_) = '\0';
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        local_d8._0_8_ = local_d8 + 0x10;
        local_70._0_8_ = (char *)0x31;
        local_d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_d8,(ulong)local_70);
        local_d8._16_8_ = local_70._0_8_;
        builtin_strncpy((char *)local_d8._0_8_,"SET must be given exactly 2 additional arguments.",
                        0x31);
        local_d8._8_8_ = local_70._0_8_;
        *(char *)(local_d8._0_8_ + local_70._0_8_) = '\0';
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar2 == 0) {
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10;
        if (lVar5 == 0x80) {
          iVar2 = std::__cxx11::string::compare((char *)(pbVar10 + 3));
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if (iVar2 != 0) {
            lVar5 = (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10;
            goto LAB_001bb794;
          }
          parent_scope = true;
        }
        else {
LAB_001bb794:
          if (lVar5 != 0x60) {
            local_d8._0_8_ = local_d8 + 0x10;
            local_70._0_8_ = (char *)0x31;
            local_d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_d8,(ulong)local_70);
            local_d8._16_8_ = local_70._0_8_;
            builtin_strncpy((char *)local_d8._0_8_,
                            "GET must be given exactly 2 additional arguments.",0x31);
            local_d8._8_8_ = local_70._0_8_;
            *(char *)(local_d8._0_8_ + local_70._0_8_) = '\0';
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_001bbab3;
          }
          parent_scope = false;
        }
        bVar1 = cmPolicies::GetPolicyID(pbVar10[1]._M_dataplus._M_p,&local_dc);
        if (!bVar1) {
          local_d8._24_8_ = pbVar10[1]._M_dataplus._M_p;
          local_d8._16_8_ = pbVar10[1]._M_string_length;
          local_d8._0_8_ = (char *)0x12;
          local_d8._8_8_ = "GET given policy \"";
          local_b8 = 0x2e;
          pcStack_b0 = "\" which is not known to this version of CMake.";
          views_01._M_len = 3;
          views_01._M_array = (iterator)local_d8;
          cmCatViews_abi_cxx11_((string *)local_70,views_01);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((undefined1 *)local_70._0_8_ == local_70 + 0x10) {
            return bVar1;
          }
LAB_001bbc81:
          operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
          return bVar1;
        }
        PVar4 = cmMakefile::GetPolicyStatus(status->Makefile,local_dc,parent_scope);
        if (REQUIRED_ALWAYS < PVar4) {
          return bVar1;
        }
        switch(PVar4) {
        case OLD:
          pcVar9 = status->Makefile;
          pcVar7 = "OLD";
          break;
        case WARN:
          pcVar9 = status->Makefile;
          pcVar7 = "";
          sVar8 = 0;
          goto LAB_001bbcd3;
        case NEW:
          pcVar9 = status->Makefile;
          pcVar7 = "NEW";
          break;
        default:
          pcVar9 = status->Makefile;
          cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_40,(cmPolicies *)(ulong)local_dc,id);
          local_d8._0_8_ = local_40._M_string_length;
          local_d8._8_8_ = local_40._M_dataplus._M_p;
          local_d8._16_8_ = (char *)0x1;
          local_d8._24_8_ =
               (long)
               ")\n  list(APPEND _cmake_expected_targets \"${_cmake_expected_target}\")\n  if(TARGET \"${_cmake_expected_target}\")\n    list(APPEND _cmake_targets_defined \"${_cmake_expected_target}\")\n  else()\n    list(APPEND _cmake_targets_not_defined \"${_cmake_expected_target}\")\n  endif()\nendforeach()\nunset(_cmake_expected_target)\nif(_cmake_targets_defined STREQUAL _cmake_expected_targets)\n  unset(_cmake_targets_defined)\n  unset(_cmake_targets_not_defined)\n  unset(_cmake_expected_targets)\n  unset(CMAKE_IMPORT_FILE_VERSION)\n  cmake_policy(POP)\n  return()\nendif()\nif(NOT _cmake_targets_defined STREQUAL \"\")\n  string(REPLACE \";\" \", \" _cmake_targets_defined_text \"${_cmake_targets_defined}\")\n  string(REPLACE \";\" \", \" _cmake_targets_not_defined_text \"${_cmake_targets_not_defined}\")\n  message(FATAL_ERROR \"Some (but not all) targets in this export set were already defined.\\nTargets Defined: ${_cmake_targets_defined_text}\\nTargets not yet defined: ${_cmake_targets_not_defined_text}\\n\")\nendif()\nunset(_cmake_targets_defined)\nunset(_cmake_targets_not_defined)\nunset(_cmake_expected_targets)\n\n\n"
               + 0x431;
          local_b8 = 0x1d;
          pcStack_b0 = "The call to cmake_policy(GET ";
          local_a0 = pbVar10[1]._M_dataplus._M_p;
          local_a8 = pbVar10[1]._M_string_length;
          local_98 = 0x51;
          local_90 = 
          " ...) at which this error appears requests the policy, and this version of CMake ";
          local_88 = 0x3c;
          local_80 = "requires that the policy be set to NEW before it is checked.";
          views_00._M_len = 6;
          views_00._M_array = (iterator)local_d8;
          cmCatViews_abi_cxx11_((string *)local_70,views_00);
          cmMakefile::IssueMessage(pcVar9,FATAL_ERROR,(string *)local_70);
          if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
            operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
          }
          local_70._16_8_ = local_40.field_2._M_allocated_capacity;
          local_70._0_8_ = local_40._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p == &local_40.field_2) {
            return bVar1;
          }
          goto LAB_001bbc81;
        }
        sVar8 = 3;
LAB_001bbcd3:
        value._M_str = pcVar7;
        value._M_len = sVar8;
        cmMakefile::AddDefinition(pcVar9,pbVar10 + 2,value);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar2 == 0) {
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          local_b8 = 0;
          pcStack_b0 = (char *)0x0;
          local_d8._16_8_ = 0;
          local_d8._24_8_ = 0;
          local_d8._0_8_ = (pointer)0x0;
          local_d8._8_8_ = (char *)0x0;
          local_a8 = 0;
          cmMakefile::PushPolicy(status->Makefile,false,(PolicyMap *)local_d8);
          return true;
        }
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"PUSH may not be given additional arguments.","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        iVar2 = std::__cxx11::string::compare
                          ((char *)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare
                            ((char *)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if (iVar2 == 0) {
            bVar1 = anon_unknown.dwarf_3796a4::HandleVersionMode
                              ((anon_unknown_dwarf_3796a4 *)pbVar10,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish,status);
            return bVar1;
          }
          iVar2 = std::__cxx11::string::compare((char *)pbVar10);
          if (iVar2 == 0) {
            bVar1 = anon_unknown.dwarf_3796a4::HandleGetWarningMode
                              ((anon_unknown_dwarf_3796a4 *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish,status);
            return bVar1;
          }
          local_d8._0_8_ = &DAT_0000001e;
          local_d8._8_8_ = "given unknown first argument \"";
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_70._8_8_ = (pbVar10->_M_dataplus)._M_p;
          local_70._0_8_ = pbVar10->_M_string_length;
          cmStrCat<char[2]>(&local_40,(cmAlphaNum *)local_d8,(cmAlphaNum *)local_70,
                            (char (*) [2])0x6a6eb3);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          local_70._16_8_ = local_40.field_2._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p == &local_40.field_2) {
            return false;
          }
          goto LAB_001bbac2;
        }
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          cmMakefile::PopPolicy(status->Makefile);
          return true;
        }
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"POP may not be given additional arguments.","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
  }
LAB_001bbab3:
  local_70._16_8_ = local_d8._16_8_;
  local_40._M_dataplus._M_p = (pointer)local_d8._0_8_;
  if ((undefined1 *)local_d8._0_8_ == local_d8 + 0x10) {
    return false;
  }
LAB_001bbac2:
  operator_delete(local_40._M_dataplus._M_p,(ulong)(local_70._16_8_ + 1));
  return false;
}

Assistant:

bool cmCMakePolicyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("requires at least one argument.");
    return false;
  }

  if (args[0] == "SET") {
    return HandleSetMode(args, status);
  }
  if (args[0] == "GET") {
    return HandleGetMode(args, status);
  }
  if (args[0] == "PUSH") {
    if (args.size() > 1) {
      status.SetError("PUSH may not be given additional arguments.");
      return false;
    }
    status.GetMakefile().PushPolicy();
    return true;
  }
  if (args[0] == "POP") {
    if (args.size() > 1) {
      status.SetError("POP may not be given additional arguments.");
      return false;
    }
    status.GetMakefile().PopPolicy();
    return true;
  }
  if (args[0] == "VERSION") {
    return HandleVersionMode(args, status);
  }
  if (args[0] == "GET_WARNING") {
    return HandleGetWarningMode(args, status);
  }

  status.SetError(cmStrCat("given unknown first argument \"", args[0], "\""));
  return false;
}